

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O1

string * rcg::anon_unknown_1::storeImagePNG
                   (string *__return_storage_ptr__,string *name,Image *image,size_t yoffset,
                   size_t height)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  FILE *pFVar7;
  __jmp_buf_tag *p_Var8;
  long *plVar9;
  png_structp ppVar10;
  undefined8 *puVar11;
  IOException *pIVar12;
  uchar *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  long lVar16;
  ulong uVar17;
  png_structp png;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  png_infop info;
  png_info local_108 [16];
  uint64_t local_f8;
  ulong local_f0;
  size_t local_e8;
  uchar *local_e0;
  uint8_t *local_d8;
  ulong local_d0;
  long local_c8;
  FILE *local_c0;
  ulong local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_e0 = (image->pixel)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar1 = image->height;
  if (height == 0) {
    height = uVar1;
  }
  local_f0 = yoffset;
  if (uVar1 < yoffset) {
    local_f0 = uVar1;
  }
  uVar17 = uVar1 - local_f0;
  if (height <= uVar1 - local_f0) {
    uVar17 = height;
  }
  uVar1 = image->width;
  local_e8 = image->xpadding;
  local_f8 = image->pixelformat;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((long)local_f8 < 0x20c005a) {
    if ((long)local_f8 < 0x1100007) {
      if ((local_f8 == 0x1080001) || (local_f8 == 0x10800c6)) {
LAB_001251bc:
        pcVar2 = (name->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_50);
        ensureNewFileName((string *)&png,&local_50);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)png != &local_128) {
          operator_delete(png);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pFVar7 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
        if (pFVar7 != (FILE *)0x0) {
          png = (png_structp)png_create_write_struct("1.6.37",0,0);
          info = (png_infop)png_create_info_struct(png);
          p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
          _setjmp(p_Var8);
          png_init_io(png,pFVar7);
          png_set_IHDR(png,info,uVar1 & 0xffffffff,uVar17 & 0xffffffff,8,0,0,0,0);
          png_write_info(png,info);
          if (uVar17 != 0) {
            lVar16 = local_e8 + uVar1;
            puVar13 = local_e0 + local_f0 * lVar16;
            do {
              png_write_row(png,puVar13);
              puVar13 = puVar13 + lVar16;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          png_write_end(png,info);
          fclose(pFVar7);
          png_destroy_write_struct(&png,&info);
          return __return_storage_ptr__;
        }
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        pIVar12 = (IOException *)operator_new(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                       "Cannot store file: ",__return_storage_ptr__);
        IOException::IOException(pIVar12,(string *)&png);
        *puVar11 = pIVar12;
        __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
      }
    }
    else if ((local_f8 == 0x1100007) || (local_f8 == 0x11000b8)) {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      ensureNewFileName((string *)&png,&local_70);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)png != &local_128) {
        operator_delete(png);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pFVar7 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      if (pFVar7 != (FILE *)0x0) {
        png = (png_structp)png_create_write_struct("1.6.37",0,0);
        info = (png_infop)png_create_info_struct(png);
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
        _setjmp(p_Var8);
        png_init_io(png,pFVar7);
        png_set_IHDR(png,info,uVar1 & 0xffffffff,uVar17 & 0xffffffff,0x10,0,0,0,0);
        png_write_info(png,info);
        if (image->bigendian == false) {
          png_set_swap(png);
        }
        if (uVar17 != 0) {
          lVar16 = local_e8 + uVar1 * 2;
          puVar13 = local_e0 + local_f0 * lVar16;
          do {
            png_write_row(png,puVar13);
            puVar13 = puVar13 + lVar16;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        png_write_end(png,info);
        fclose(pFVar7);
        png_destroy_write_struct(&png,&info);
        return __return_storage_ptr__;
      }
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar12 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar12,(string *)&png);
      *puVar11 = pIVar12;
      __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
  }
  else if ((long)local_f8 < 0x210003b) {
    if ((local_f8 == 0x20c005a) || (local_f8 == 0x2100032)) {
LAB_00125354:
      pcVar2 = (name->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + name->_M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      local_d0 = uVar17;
      ensureNewFileName((string *)&png,&local_90);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)png != &local_128) {
        operator_delete(png);
      }
      uVar17 = local_d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pFVar7 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      if (pFVar7 != (FILE *)0x0) {
        png = (png_structp)png_create_write_struct("1.6.37",0,0);
        info = (png_infop)png_create_info_struct(png);
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
        _setjmp(p_Var8);
        png_init_io(png,pFVar7);
        png_set_IHDR(png,info,uVar1 & 0xffffffff,uVar17 & 0xffffffff,8,2,0,0,0);
        png_write_info(png,info);
        puVar4 = (uint8_t *)operator_new__(uVar1 * 3);
        if (local_f8 == 0x20c005a) {
          uVar5 = (uVar1 >> 1 & 0xfffffffffffffffe) * 3;
        }
        else {
          uVar5 = uVar1 * 2 & 0xfffffffffffffff8;
        }
        local_c0 = pFVar7;
        if (uVar17 != 0) {
          local_c8 = uVar5 + local_e8;
          puVar14 = local_e0 + local_f0 * local_c8;
          uVar17 = 0;
          do {
            if (local_f8 == 0x20c005a) {
              if (uVar1 != 0) {
                uVar5 = 0;
                puVar15 = puVar4;
                do {
                  convYCbCr411toQuadRGB(puVar15,puVar14,(int)uVar5);
                  uVar5 = uVar5 + 4;
                  puVar15 = puVar15 + 0xc;
                } while (uVar5 < uVar1);
              }
            }
            else if (uVar1 != 0) {
              uVar5 = 0;
              puVar15 = puVar4;
              do {
                convYCbCr422toQuadRGB(puVar15,puVar14,(int)uVar5);
                uVar5 = uVar5 + 4;
                puVar15 = puVar15 + 0xc;
              } while (uVar5 < uVar1);
            }
            png_write_row(png,puVar4);
            puVar14 = puVar14 + local_c8;
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_d0);
        }
        png_write_end(png,info);
        fclose(local_c0);
        png_destroy_write_struct(&png,&info);
        return __return_storage_ptr__;
      }
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar12 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar12,(string *)&png);
      *puVar11 = pIVar12;
      __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
  }
  else {
    if (local_f8 == 0x210003b) goto LAB_00125354;
    if (local_f8 == 0x81080001) goto LAB_001251bc;
  }
  uVar5 = uVar1 * 3;
  local_d8 = (uint8_t *)operator_new__(uVar17 * uVar5);
  uVar6 = uVar1;
  if (local_f8 == 0x2180014) {
    uVar6 = uVar5;
  }
  local_b8 = uVar5;
  bVar3 = convertImage(local_d8,(uint8_t *)0x0,local_e0 + (uVar6 + local_e8) * local_f0,local_f8,
                       uVar1,uVar17,local_e8);
  if (bVar3) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
    puVar4 = local_d8;
    std::__cxx11::string::append((char *)&local_b0);
    ensureNewFileName((string *)&png,&local_b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)png != &local_128) {
      operator_delete(png);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pFVar7 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
    if (pFVar7 != (FILE *)0x0) {
      png = (png_structp)png_create_write_struct("1.6.37",0,0);
      info = (png_infop)png_create_info_struct(png);
      p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
      _setjmp(p_Var8);
      png_init_io(png,pFVar7);
      png_set_IHDR(png,info,uVar1 & 0xffffffff,uVar17 & 0xffffffff,8,2,0,0,0);
      png_write_info(png,info);
      uVar1 = local_b8;
      puVar14 = puVar4;
      for (; uVar17 != 0; uVar17 = uVar17 - 1) {
        png_write_row(png,puVar14);
        puVar14 = puVar14 + uVar1;
      }
      png_write_end(png,info);
      fclose(pFVar7);
      png_destroy_write_struct(&png,&info);
      operator_delete__(puVar4);
      return __return_storage_ptr__;
    }
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    pIVar12 = (IOException *)operator_new(0x28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                   "Cannot store file: ",__return_storage_ptr__);
    IOException::IOException(pIVar12,(string *)&png);
    *puVar11 = pIVar12;
    __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
  }
  pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
  info = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&info,"storeImage(): Unsupported pixel format: ","");
  GetPixelFormatName((PfncFormat)image->pixelformat);
  plVar9 = (long *)std::__cxx11::string::append((char *)&info);
  png = (png_structp)*plVar9;
  ppVar10 = (png_structp)(plVar9 + 2);
  if (png == ppVar10) {
    local_128._M_allocated_capacity = *(undefined8 *)ppVar10;
    local_128._8_8_ = plVar9[3];
    png = (png_structp)&local_128;
  }
  else {
    local_128._M_allocated_capacity = *(undefined8 *)ppVar10;
  }
  local_130 = plVar9[1];
  *plVar9 = (long)ppVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  IOException::IOException(pIVar12,(string *)&png);
  __cxa_throw(pIVar12,&(anonymous_namespace)::IOException::typeinfo,IOException::~IOException);
}

Assistant:

std::string storeImagePNG(const std::string &name, const Image &image, size_t yoffset,
  size_t height)
{
  size_t width=image.getWidth();
  size_t real_height=image.getHeight();

  if (height == 0) height=real_height;

  yoffset=std::min(yoffset, real_height);
  height=std::min(height, real_height-yoffset);

  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels());

  size_t px=image.getXPadding();

  uint64_t format=image.getPixelFormat();
  std::string full_name;

  switch (format)
  {
    case Mono8: // store 8 bit monochrome image
    case Confidence8:
    case Error8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        p+=(width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case Mono16:
    case Coord3D_C16: // store 16 bit monochrome image
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 16, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        if (!image.isBigEndian())
        {
          png_set_swap(png);
        }

        p+=(2*width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=2*width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case YCbCr411_8: // convert and store as color image
    case YCbCr422_8:
    case YUV422_8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        uint8_t *tmp=new uint8_t [3*width];

        size_t pstep;
        if (format == YCbCr411_8)
        {
          pstep=(width>>2)*6+px;
        }
        else
        {
          pstep=(width>>2)*8+px;
        }

        p+=pstep*yoffset;
        for (size_t k=0; k<height; k++)
        {
          if (format == YCbCr411_8)
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr411toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }
          else
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr422toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }

          png_write_row(png, tmp);
          p+=pstep;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    default: // try to store as color image
      {
        std::unique_ptr<uint8_t []> rgb_pixel(new uint8_t [3*width*height]);

        if (format == RGB8)
        {
          p+=(3*width+px)*yoffset;
        }
        else
        {
          p+=(width+px)*yoffset;
        }

        if (convertImage(rgb_pixel.get(), 0, p, format, width, height, px))
        {
          p=rgb_pixel.get();

          // open file and init

          full_name=ensureNewFileName(name+".png");
          FILE *out=fopen(full_name.c_str(), "wb");

          if (!out)
          {
            throw new IOException("Cannot store file: "+full_name);
          }

          png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
          png_infop info=png_create_info_struct(png);
          setjmp(png_jmpbuf(png));

          // write header

          png_init_io(png, out);
          png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
            PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
            PNG_FILTER_TYPE_DEFAULT);
          png_write_info(png, info);

          // write image body

          for (size_t k=0; k<height; k++)
          {
            png_write_row(png, const_cast<png_bytep>(p));
            p+=3*width;
          }

          // close file

          png_write_end(png, info);
          fclose(out);
          png_destroy_write_struct(&png, &info);
        }
        else
        {
          throw IOException(std::string("storeImage(): Unsupported pixel format: ")+
            GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
        }
      }
      break;
  }

  return full_name;
}